

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv__stream_open(uv_stream_t *stream,int fd,int flags)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  
  iVar1 = (stream->io_watcher).fd;
  if (iVar1 != -1 && iVar1 != fd) {
    return -0x10;
  }
  if (-1 < fd) {
    uVar3 = flags | stream->flags;
    stream->flags = uVar3;
    if ((stream->type == UV_TCP) &&
       ((((uVar3 >> 0x18 & 1) != 0 && (iVar1 = uv__tcp_nodelay(fd,1), iVar1 != 0)) ||
        (((stream->flags & 0x2000000) != 0 && (iVar1 = uv__tcp_keepalive(fd,1,0x3c), iVar1 != 0)))))
       ) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    (stream->io_watcher).fd = fd;
    return 0;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                ,0x19b,"int uv__stream_open(uv_stream_t *, int, int)");
}

Assistant:

int uv__stream_open(uv_stream_t* stream, int fd, int flags) {
#if defined(__APPLE__)
  int enable;
#endif

  if (!(stream->io_watcher.fd == -1 || stream->io_watcher.fd == fd))
    return UV_EBUSY;

  assert(fd >= 0);
  stream->flags |= flags;

  if (stream->type == UV_TCP) {
    if ((stream->flags & UV_HANDLE_TCP_NODELAY) && uv__tcp_nodelay(fd, 1))
      return UV__ERR(errno);

    /* TODO Use delay the user passed in. */
    if ((stream->flags & UV_HANDLE_TCP_KEEPALIVE) &&
        uv__tcp_keepalive(fd, 1, 60)) {
      return UV__ERR(errno);
    }
  }

#if defined(__APPLE__)
  enable = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_OOBINLINE, &enable, sizeof(enable)) &&
      errno != ENOTSOCK &&
      errno != EINVAL) {
    return UV__ERR(errno);
  }
#endif

  stream->io_watcher.fd = fd;

  return 0;
}